

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

uint32_t __thiscall spvtools::opt::IRContext::GetBuiltinInputVarId(IRContext *this,uint32_t builtin)

{
  byte *pbVar1;
  TypeManager *this_00;
  uint32_t uVar2;
  iterator iVar3;
  Type *pTVar4;
  Instruction *this_01;
  mapped_type *pmVar5;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_02;
  Float float_ty;
  Vector v3float_ty;
  uint32_t local_c0;
  uint32_t local_bc;
  undefined1 local_b8 [16];
  PodType PStack_a8;
  PodType PStack_a4;
  pointer local_a0;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  undefined1 local_90;
  undefined1 local_80 [32];
  undefined1 *local_60;
  Type *local_58;
  undefined1 local_50 [8];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_c0 = builtin;
  if ((this->valid_analyses_ & kAnalysisBuiltinVarId) == kAnalysisNone) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->builtin_var_id_map_)._M_h);
    pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->builtin_var_id_map_)._M_h,&local_c0);
  if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    return *(uint32_t *)
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                   _M_cur + 0xc);
  }
  uVar2 = FindBuiltinInputVar(this,local_c0);
  if (uVar2 != 0) goto LAB_00236003;
  if ((this->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    BuildTypeManager(this);
  }
  this_00 = (this->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((int)local_c0 < 0x29) {
    if ((int)local_c0 < 0xf) {
      if (local_c0 - 7 < 2) goto LAB_00235bd4;
      if (local_c0 != 0xd) {
LAB_00235c40:
        __assert_fail("false && \"unhandled builtin\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp"
                      ,0x388,"uint32_t spvtools::opt::IRContext::GetBuiltinInputVarId(uint32_t)");
      }
      local_b8._8_8_ = (pointer)0x0;
      PStack_a8.data._M_elems = (array<signed_char,_4UL>)0x0;
      PStack_a4.data._M_elems = (array<signed_char,_4UL>)0x0;
      local_a0 = (pointer)0x0;
      local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2000000003;
      local_b8._0_8_ = &PTR__Type_003dbaf0;
      pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_b8);
      uVar2 = 3;
    }
    else {
      if (local_c0 != 0xf) {
        if (local_c0 != 0x1c) goto LAB_00235c40;
LAB_00235c69:
        local_b8._8_8_ = (pointer)0x0;
        PStack_a8.data._M_elems = (array<signed_char,_4UL>)0x0;
        PStack_a4.data._M_elems = (array<signed_char,_4UL>)0x0;
        local_a0 = (pointer)0x0;
        local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2000000002;
        local_b8._0_8_ = &PTR__Type_003db8d0;
        local_90 = 0;
        pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_b8);
        uVar2 = 3;
        goto LAB_00235d9d;
      }
      local_b8._8_8_ = (pointer)0x0;
      PStack_a8.data._M_elems = (array<signed_char,_4UL>)0x0;
      PStack_a4.data._M_elems = (array<signed_char,_4UL>)0x0;
      local_a0 = (pointer)0x0;
      local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2000000003;
      local_b8._0_8_ = &PTR__Type_003dbaf0;
      pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_b8);
      uVar2 = 4;
    }
    analysis::Vector::Vector((Vector *)local_80,pTVar4,uVar2);
    pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_80);
    local_80._0_8_ = &PTR__Type_003d7f68;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)(local_80 + 8));
    local_b8._0_8_ = &PTR__Type_003d7f68;
    this_02 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)(local_b8 + 8);
  }
  else if (local_c0 - 0x29 < 3) {
LAB_00235bd4:
    this_02 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)(local_80 + 8);
    local_80._8_8_ = (pointer)0x0;
    local_80._16_8_ = (pointer)0x0;
    local_80._24_8_ = (pointer)0x0;
    local_60 = (undefined1 *)0x2000000002;
    local_80._0_8_ = &PTR__Type_003db8d0;
    local_58 = (Type *)((ulong)local_58 & 0xffffffffffffff00);
    pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_80);
    local_80._0_8_ = &PTR__Type_003d7f68;
  }
  else {
    if (local_c0 != 0x1144) {
      if (local_c0 != 0x14c7) goto LAB_00235c40;
      goto LAB_00235c69;
    }
    local_b8._8_8_ = (pointer)0x0;
    PStack_a8.data._M_elems = (array<signed_char,_4UL>)0x0;
    PStack_a4.data._M_elems = (array<signed_char,_4UL>)0x0;
    local_a0 = (pointer)0x0;
    local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2000000002;
    local_b8._0_8_ = &PTR__Type_003db8d0;
    local_90 = 0;
    pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_b8);
    uVar2 = 4;
LAB_00235d9d:
    this_02 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)(local_b8 + 8);
    analysis::Vector::Vector((Vector *)local_80,pTVar4,uVar2);
    pTVar4 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)local_80);
    local_80._0_8_ = &PTR__Type_003d7f68;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)(local_80 + 8));
    local_b8._0_8_ = &PTR__Type_003d7f68;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(this_02);
  uVar2 = analysis::TypeManager::GetTypeInstruction(this_00,pTVar4);
  local_bc = analysis::TypeManager::FindPointerToType(this_00,uVar2,Input);
  uVar2 = Module::TakeNextIdBound
                    ((this->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((uVar2 == 0) && ((this->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_80._0_8_ = local_80 + 0x10;
    local_b8._0_8_ = (pointer)0x25;
    local_80._0_8_ = std::__cxx11::string::_M_create((ulong *)local_80,(ulong)local_b8);
    local_80._16_8_ = local_b8._0_8_;
    *(undefined8 *)local_80._0_8_ = 0x667265766f204449;
    *(undefined8 *)(local_80._0_8_ + 8) = 0x797254202e776f6c;
    *(undefined8 *)(local_80._0_8_ + 0x10) = 0x676e696e6e757220;
    *(undefined8 *)(local_80._0_8_ + 0x18) = 0x746361706d6f6320;
    builtin_strncpy((char *)(local_80._0_8_ + 0x1d),"act-ids.",8);
    local_80._8_8_ = local_b8._0_8_;
    *(char *)(local_80._0_8_ + local_b8._0_8_) = '\0';
    local_b8._0_8_ = (_func_int **)0x0;
    local_b8._8_8_ = (pointer)0x0;
    PStack_a8.data._M_elems = (array<signed_char,_4UL>)0x0;
    PStack_a4.data._M_elems = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&this->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_b8,(char *)local_80._0_8_);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,
                      (ulong)((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      local_80._16_8_)->_M_impl).super__Vector_impl_data._M_start +
                             1));
    }
  }
  this_01 = (Instruction *)operator_new(0x70);
  local_a0 = (pointer)&PStack_a8;
  local_b8._0_8_ = &PTR__SmallVector_003d7c78;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  PStack_a8.data._M_elems = (array<signed_char,_4UL>)0x1;
  local_b8._8_8_ = (pointer)0x1;
  local_80._0_4_ = 6;
  local_80._8_8_ = &PTR__SmallVector_003d7c78;
  local_80._16_8_ = (pointer)0x0;
  local_60 = local_80 + 0x18;
  local_58 = (Type *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_80 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_80,local_50);
  Instruction::Instruction(this_01,this,OpVariable,local_bc,uVar2,(OperandList *)&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  local_80._8_8_ = &PTR__SmallVector_003d7c78;
  if (local_58 != (Type *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_58,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  }
  local_58 = (Type *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_003d7c78;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    BuildDefUseManager(this);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((this->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             this_01);
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((this->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_)
              .super_IntrusiveList<spvtools::opt::Instruction>,this_01);
  if ((this->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    BuildDecorationManager(this);
  }
  analysis::DecorationManager::AddDecorationVal
            ((this->decoration_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
             _M_head_impl,uVar2,0xb,local_c0);
  AddVarToEntryPoints(this,uVar2);
LAB_00236003:
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->builtin_var_id_map_,&local_c0);
  *pmVar5 = uVar2;
  return uVar2;
}

Assistant:

uint32_t IRContext::GetBuiltinInputVarId(uint32_t builtin) {
  if (!AreAnalysesValid(kAnalysisBuiltinVarId)) ResetBuiltinAnalysis();
  // If cached, return it.
  std::unordered_map<uint32_t, uint32_t>::iterator it =
      builtin_var_id_map_.find(builtin);
  if (it != builtin_var_id_map_.end()) return it->second;
  // Look for one in shader
  uint32_t var_id = FindBuiltinInputVar(builtin);
  if (var_id == 0) {
    // If not found, create it
    // TODO(greg-lunarg): Add support for all builtins
    analysis::TypeManager* type_mgr = get_type_mgr();
    analysis::Type* reg_type;
    switch (spv::BuiltIn(builtin)) {
      case spv::BuiltIn::FragCoord: {
        analysis::Float float_ty(32);
        analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
        analysis::Vector v4float_ty(reg_float_ty, 4);
        reg_type = type_mgr->GetRegisteredType(&v4float_ty);
        break;
      }
      case spv::BuiltIn::VertexIndex:
      case spv::BuiltIn::InstanceIndex:
      case spv::BuiltIn::PrimitiveId:
      case spv::BuiltIn::InvocationId:
      case spv::BuiltIn::SubgroupLocalInvocationId: {
        analysis::Integer uint_ty(32, false);
        reg_type = type_mgr->GetRegisteredType(&uint_ty);
        break;
      }
      case spv::BuiltIn::GlobalInvocationId:
      case spv::BuiltIn::LaunchIdNV: {
        analysis::Integer uint_ty(32, false);
        analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
        analysis::Vector v3uint_ty(reg_uint_ty, 3);
        reg_type = type_mgr->GetRegisteredType(&v3uint_ty);
        break;
      }
      case spv::BuiltIn::TessCoord: {
        analysis::Float float_ty(32);
        analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
        analysis::Vector v3float_ty(reg_float_ty, 3);
        reg_type = type_mgr->GetRegisteredType(&v3float_ty);
        break;
      }
      case spv::BuiltIn::SubgroupLtMask: {
        analysis::Integer uint_ty(32, false);
        analysis::Type* reg_uint_ty = type_mgr->GetRegisteredType(&uint_ty);
        analysis::Vector v4uint_ty(reg_uint_ty, 4);
        reg_type = type_mgr->GetRegisteredType(&v4uint_ty);
        break;
      }
      default: {
        assert(false && "unhandled builtin");
        return 0;
      }
    }
    uint32_t type_id = type_mgr->GetTypeInstruction(reg_type);
    uint32_t varTyPtrId =
        type_mgr->FindPointerToType(type_id, spv::StorageClass::Input);
    // TODO(1841): Handle id overflow.
    var_id = TakeNextId();
    std::unique_ptr<Instruction> newVarOp(
        new Instruction(this, spv::Op::OpVariable, varTyPtrId, var_id,
                        {{spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
                          {uint32_t(spv::StorageClass::Input)}}}));
    get_def_use_mgr()->AnalyzeInstDefUse(&*newVarOp);
    module()->AddGlobalValue(std::move(newVarOp));
    get_decoration_mgr()->AddDecorationVal(
        var_id, uint32_t(spv::Decoration::BuiltIn), builtin);
    AddVarToEntryPoints(var_id);
  }
  builtin_var_id_map_[builtin] = var_id;
  return var_id;
}